

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

string_t duckdb::NumericHelper::FormatSigned<signed_char>(char value,Vector *vector)

{
  uint8_t value_00;
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  idx_t len;
  undefined1 *puVar4;
  byte bVar5;
  byte bVar6;
  Vector *vector_00;
  string_t result;
  undefined1 local_30 [16];
  
  bVar5 = value >> 7;
  bVar6 = ((char)(value ^ bVar5) >> 7) - bVar5;
  value_00 = (bVar5 ^ value) + bVar6;
  iVar1 = UnsignedLength<unsigned_char>(value_00);
  vector_00 = (Vector *)(long)(int)((uint)bVar6 + iVar1);
  local_30 = (undefined1  [16])StringVector::EmptyString((StringVector *)vector,vector_00,len);
  puVar4 = local_30._8_8_;
  if (local_30._0_4_ < 0xd) {
    puVar4 = local_30 + 4;
  }
  pcVar2 = FormatUnsigned<unsigned_char>(value_00,puVar4 + (long)&vector_00->vector_type);
  if (value < '\0') {
    pcVar2[-1] = '-';
  }
  uVar3 = (ulong)(uint)local_30._0_4_;
  if (uVar3 < 0xd) {
    switchD_0105b559::default(local_30 + 4 + uVar3,0,0xc - uVar3);
  }
  else {
    local_30._4_4_ = *(undefined4 *)local_30._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_30;
}

Assistant:

static string_t FormatSigned(T value, Vector &vector) {
		typedef typename MakeUnsigned<T>::type unsigned_t;
		int8_t sign = -(value < 0);
		unsigned_t unsigned_value = unsigned_t(value ^ T(sign)) + unsigned_t(AbsValue(sign));
		auto length = UnsafeNumericCast<idx_t>(UnsignedLength<unsigned_t>(unsigned_value) + AbsValue(sign));
		string_t result = StringVector::EmptyString(vector, length);
		auto dataptr = result.GetDataWriteable();
		auto endptr = dataptr + length;
		endptr = FormatUnsigned(unsigned_value, endptr);
		if (sign) {
			*--endptr = '-';
		}
		result.Finalize();
		return result;
	}